

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_gettable(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  
  pTVar2 = index2adr(L,idx);
  pcVar3 = lj_meta_tget(L,pTVar2,L->top + -1);
  pTVar2 = L->top;
  if (pcVar3 == (cTValue *)0x0) {
    L->top = pTVar2 + 2;
    lj_vm_call(L,pTVar2,2);
    pTVar1 = L->top;
    pTVar2 = pTVar1 + -3;
    L->top = pTVar2;
    pcVar3 = pTVar1 + -1;
  }
  pTVar2[-1] = *pcVar3;
  return;
}

Assistant:

LUA_API void lua_gettable(lua_State *L, int idx)
{
  cTValue *t = index2adr_check(L, idx);
  cTValue *v = lj_meta_tget(L, t, L->top-1);
  if (v == NULL) {
    L->top += 2;
    lj_vm_call(L, L->top-2, 1+1);
    L->top -= 2+LJ_FR2;
    v = L->top+1+LJ_FR2;
  }
  copyTV(L, L->top-1, v);
}